

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O2

ON_SubDFace * __thiscall ON_SubDLevel::AddFace(ON_SubDLevel *this,ON_SubDFace *face)

{
  ON_SubDFace *pOVar1;
  
  if (face != (ON_SubDFace *)0x0) {
    if (this->m_face[1] == (ON_SubDFace *)0x0) {
      this->m_face[0] = face;
      pOVar1 = (ON_SubDFace *)0x0;
    }
    else {
      this->m_face[1]->m_next_face = face;
      pOVar1 = this->m_face[1];
    }
    face->m_prev_face = pOVar1;
    this->m_face[1] = face;
    face->m_next_face = (ON_SubDFace *)0x0;
    this->m_face_count = this->m_face_count + 1;
    ResetFaceArray(this);
  }
  return face;
}

Assistant:

const ON_SubDFace* AddFace(class ON_SubDFace* face)
  {
    if (nullptr == face)
      return nullptr;
    if (nullptr == m_face[1])
    {
      m_face[0] = face;
      face->m_prev_face = nullptr;
    }
    else
    {
      m_face[1]->m_next_face = face;
      face->m_prev_face = m_face[1];
    }
    m_face[1] = face;
    face->m_next_face = nullptr;
    m_face_count++;
    ResetFaceArray();
    return face;
  }